

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encrypted_client_hello.cc
# Opt level: O2

bool __thiscall
bssl::ECHServerConfig::SetupContext
          (ECHServerConfig *this,EVP_HPKE_CTX *ctx,uint16_t kdf_id,uint16_t aead_id,
          Span<const_unsigned_char> enc)

{
  int iVar1;
  EVP_HPKE_AEAD *pEVar2;
  EVP_HPKE_KDF *kdf;
  uint8_t *info;
  size_t info_len;
  bool bVar3;
  uint16_t supported_aead_id;
  EVP_HPKE_CTX *local_88;
  uchar *local_80;
  size_t local_78;
  ScopedCBB info_cbb;
  CBS cbs;
  
  local_78 = enc.size_;
  local_80 = enc.data_;
  cbs.data = (this->ech_config_).cipher_suites.data_;
  cbs.len = (this->ech_config_).cipher_suites.size_;
  local_88 = ctx;
  do {
    if (((cbs.len == 0) || (iVar1 = CBS_get_u16(&cbs,(uint16_t *)&info_cbb), iVar1 == 0)) ||
       (iVar1 = CBS_get_u16(&cbs,&supported_aead_id), iVar1 == 0)) {
      return false;
    }
  } while (((uint16_t)info_cbb.ctx_.child != kdf_id) || (supported_aead_id != aead_id));
  CBB_zero(&info_cbb.ctx_);
  iVar1 = CBB_init(&info_cbb.ctx_,(this->ech_config_).raw.size_ + 8);
  if ((iVar1 == 0) ||
     ((iVar1 = CBB_add_bytes(&info_cbb.ctx_,"tls ech",8), iVar1 == 0 ||
      (iVar1 = CBB_add_bytes(&info_cbb.ctx_,(this->ech_config_).raw.data_,
                             (this->ech_config_).raw.size_), iVar1 == 0)))) {
    bVar3 = false;
  }
  else {
    if (kdf_id != 1) {
      __assert_fail("kdf_id == EVP_HPKE_HKDF_SHA256",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/encrypted_client_hello.cc"
                    ,0x24a,
                    "bool bssl::ECHServerConfig::SetupContext(EVP_HPKE_CTX *, uint16_t, uint16_t, Span<const uint8_t>) const"
                   );
    }
    pEVar2 = get_ech_aead(aead_id);
    if (pEVar2 == (EVP_HPKE_AEAD *)0x0) {
      __assert_fail("get_ech_aead(aead_id) != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/encrypted_client_hello.cc"
                    ,0x24b,
                    "bool bssl::ECHServerConfig::SetupContext(EVP_HPKE_CTX *, uint16_t, uint16_t, Span<const uint8_t>) const"
                   );
    }
    kdf = EVP_hpke_hkdf_sha256();
    pEVar2 = get_ech_aead(aead_id);
    info = CBB_data(&info_cbb.ctx_);
    info_len = CBB_len(&info_cbb.ctx_);
    iVar1 = EVP_HPKE_CTX_setup_recipient
                      (local_88,&(this->key_).ctx_,kdf,pEVar2,local_80,local_78,info,info_len);
    bVar3 = iVar1 != 0;
  }
  internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated(&info_cbb);
  return bVar3;
}

Assistant:

bool ECHServerConfig::SetupContext(EVP_HPKE_CTX *ctx, uint16_t kdf_id,
                                   uint16_t aead_id,
                                   Span<const uint8_t> enc) const {
  // Check the cipher suite is supported by this ECHServerConfig.
  CBS cbs(ech_config_.cipher_suites);
  bool cipher_ok = false;
  while (CBS_len(&cbs) != 0) {
    uint16_t supported_kdf_id, supported_aead_id;
    if (!CBS_get_u16(&cbs, &supported_kdf_id) ||
        !CBS_get_u16(&cbs, &supported_aead_id)) {
      return false;
    }
    if (kdf_id == supported_kdf_id && aead_id == supported_aead_id) {
      cipher_ok = true;
      break;
    }
  }
  if (!cipher_ok) {
    return false;
  }

  static const uint8_t kInfoLabel[] = "tls ech";
  ScopedCBB info_cbb;
  if (!CBB_init(info_cbb.get(), sizeof(kInfoLabel) + ech_config_.raw.size()) ||
      !CBB_add_bytes(info_cbb.get(), kInfoLabel,
                     sizeof(kInfoLabel) /* includes trailing NUL */) ||
      !CBB_add_bytes(info_cbb.get(), ech_config_.raw.data(),
                     ech_config_.raw.size())) {
    return false;
  }

  assert(kdf_id == EVP_HPKE_HKDF_SHA256);
  assert(get_ech_aead(aead_id) != NULL);
  return EVP_HPKE_CTX_setup_recipient(ctx, key_.get(), EVP_hpke_hkdf_sha256(),
                                      get_ech_aead(aead_id), enc.data(),
                                      enc.size(), CBB_data(info_cbb.get()),
                                      CBB_len(info_cbb.get()));
}